

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall asmjit::Assembler::sync(Assembler *this)

{
  ulong uVar1;
  size_t offset;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  
  if ((this->super_CodeEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (this->_section == (SectionEntry *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (this->_bufferData != (this->_section->_buffer)._data) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  uVar1 = (long)this->_bufferPtr - (long)this->_bufferData;
  if ((this->_section->_buffer)._length < uVar1) {
    (this->_section->_buffer)._length = uVar1;
  }
  return;
}

Assistant:

void Assembler::sync() noexcept {
  ASMJIT_ASSERT(_code != nullptr);                       // Only called by CodeHolder, so we must be attached.
  ASMJIT_ASSERT(_section != nullptr);                    // One section must always be active, no matter what.
  ASMJIT_ASSERT(_bufferData == _section->_buffer._data); // `_bufferStart` is a shortcut to `_section->buffer.data`.

  // Update only if the current offset is greater than the section length.
  size_t offset = (size_t)(_bufferPtr - _bufferData);
  if (_section->getBuffer().getLength() < offset)
    _section->_buffer._length = offset;
}